

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,uchar *head,size_t size
              ,string *err)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  uchar **ppuVar6;
  const_reference pvVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  long in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long in_RSI;
  long *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  string *in_R9;
  int c;
  stringstream ss_4;
  tinyexr_int64 lno;
  int num_lines;
  int end_line_no;
  int data_len_1;
  int line_no;
  uchar *data_ptr_1;
  size_t data_size_1;
  size_t y_idx;
  int y;
  stringstream ss_3;
  bool total_data_len_overflown;
  size_t total_data_len;
  bool ret;
  int data_len;
  int tile_coordinates [4];
  uchar *data_ptr;
  size_t data_size;
  size_t tile_idx;
  int err_code;
  size_t num_tiles;
  stringstream ss_2;
  stringstream ss_1;
  bool invalid_data;
  size_t channel_offset;
  int pixel_data_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  size_t num_blocks;
  stringstream ss;
  int threshold;
  int data_height;
  int data_width;
  int num_scanline_blocks;
  int num_channels;
  int local_b38 [2];
  int local_b30;
  int in_stack_fffffffffffff4d8;
  int in_stack_fffffffffffff4dc;
  int in_stack_fffffffffffff4e0;
  int in_stack_fffffffffffff4e4;
  int in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  undefined4 in_stack_fffffffffffff4f0;
  int in_stack_fffffffffffff4f4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff4f8;
  uchar *in_stack_fffffffffffff538;
  int *in_stack_fffffffffffff540;
  int *in_stack_fffffffffffff548;
  int *in_stack_fffffffffffff550;
  undefined7 in_stack_fffffffffffff558;
  undefined1 in_stack_fffffffffffff55f;
  undefined8 in_stack_fffffffffffff5a0;
  undefined8 in_stack_fffffffffffff5a8;
  undefined8 in_stack_fffffffffffff5b0;
  undefined8 in_stack_fffffffffffff5b8;
  undefined7 in_stack_fffffffffffff600;
  undefined1 in_stack_fffffffffffff607;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  int local_984;
  stringstream local_980 [392];
  long local_7f8;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  int local_7e4;
  int local_7e0;
  int local_7dc;
  int *local_7d8;
  ulong local_7d0;
  size_type local_7c8;
  int local_7bc;
  string local_7b8 [32];
  stringstream local_798 [16];
  ostream local_788 [48];
  int in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8ac;
  size_t in_stack_fffffffffffff8b0;
  uchar *in_stack_fffffffffffff8b8;
  int *in_stack_fffffffffffff8c0;
  uchar **in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff900;
  int in_stack_fffffffffffff908;
  size_t in_stack_fffffffffffff910;
  size_t in_stack_fffffffffffff918;
  EXRAttribute *in_stack_fffffffffffff920;
  size_t in_stack_fffffffffffff928;
  EXRChannelInfo *in_stack_fffffffffffff930;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff938;
  int local_5fc;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 *local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  int local_5cc;
  size_type local_5c8;
  string local_5c0 [32];
  stringstream local_5a0 [16];
  ostream local_590 [376];
  string local_418 [32];
  stringstream local_3f8 [16];
  ostream local_3e8 [379];
  byte local_26d;
  undefined4 local_26c;
  undefined8 local_268;
  int local_25c;
  undefined1 local_258 [24];
  size_type local_240;
  string local_238 [48];
  stringstream local_208 [16];
  ostream local_1f8 [380];
  undefined4 local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  string *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  long local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  long local_48;
  long *local_40;
  int local_34;
  
  local_6c = *(int *)(in_RSI + 0x78);
  local_70 = 1;
  if (*(int *)(in_RSI + 0x7c) == 3) {
    local_70 = 0x10;
  }
  else if (*(int *)(in_RSI + 0x7c) == 4) {
    local_70 = 0x20;
  }
  else if (*(int *)(in_RSI + 0x7c) == 0x80) {
    local_70 = 0x10;
  }
  if ((*(int *)(in_RSI + 0x10) < *(int *)(in_RSI + 8)) ||
     (*(int *)(in_RSI + 0x14) < *(int *)(in_RSI + 0xc))) {
    if (in_R9 != (string *)0x0) {
      std::__cxx11::string::operator+=(in_R9,"Invalid data window.\n");
    }
    return -4;
  }
  local_74 = (*(int *)(in_RSI + 0x10) - *(int *)(in_RSI + 8)) + 1;
  local_78 = (*(int *)(in_RSI + 0x14) - *(int *)(in_RSI + 0xc)) + 1;
  local_7c = 0x800000;
  local_68 = in_R9;
  if ((0x800000 < local_74) || (0x800000 < local_78)) {
    if (in_R9 != (string *)0x0) {
      std::__cxx11::stringstream::stringstream(local_208);
      poVar4 = std::operator<<(local_1f8,"data_with or data_height too large. data_width: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_74);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"data_height = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=(local_68,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::stringstream::~stringstream(local_208);
    }
    return -4;
  }
  local_60 = in_R8;
  local_58 = in_RCX;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  local_240 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ec891);
  local_25c = 0;
  local_268 = 0;
  bVar2 = ComputeChannelLayout
                    (in_stack_fffffffffffff4f8,
                     (int *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
                     (size_t *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                     in_stack_fffffffffffff4e4,
                     (EXRChannelInfo *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8)
                    );
  if (!bVar2) {
    if (local_68 != (string *)0x0) {
      std::__cxx11::string::operator+=(local_68,"Failed to compute channel layout.\n");
    }
    local_34 = -4;
    goto LAB_001ed85a;
  }
  local_26d = 0;
  if (*(int *)(local_48 + 0x38) == 0) {
    uVar8 = (long)local_74 * (long)local_78 * (long)local_6c;
    if ((uVar8 == 0) || (0x3fffffffff < uVar8)) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_798);
        poVar4 = std::operator<<(local_788,"Image data size is zero or too large: width = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_74);
        poVar4 = std::operator<<(poVar4,", height = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78);
        poVar4 = std::operator<<(poVar4,", channels = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_7b8);
        std::__cxx11::string::~string(local_7b8);
        std::__cxx11::stringstream::~stringstream(local_798);
      }
      local_34 = -4;
      goto LAB_001ed85a;
    }
    ppuVar6 = AllocateImage(in_stack_fffffffffffff4f4,
                            (EXRChannelInfo *)
                            CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                            (int *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                            in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8);
    local_40[1] = (long)ppuVar6;
    for (local_7bc = 0; local_7bc < (int)local_240; local_7bc = local_7bc + 1) {
      local_7c8 = (size_type)local_7bc;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_7c8);
      pvVar11 = local_60;
      if (local_60 < (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(*pvVar7 + 8)) {
        local_26d = 1;
      }
      else {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_50,local_7c8);
        lVar1 = local_58;
        local_7d0 = (long)pvVar11 - (*pvVar7 + 8);
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_50,local_7c8);
        local_7d8 = (int *)(lVar1 + *pvVar7);
        local_7dc = *local_7d8;
        local_7e0 = local_7d8[1];
        swap4(&local_7dc);
        swap4(&local_7e0);
        if (local_7d0 < (ulong)(long)local_7e0) {
          local_26d = 1;
        }
        else if ((local_7dc < 0x200001) && (-0x200001 < local_7dc)) {
          if (local_7e0 == 0) {
            local_26d = 1;
          }
          else {
            local_7e8 = local_7dc + local_70;
            local_7ec = *(int *)(local_48 + 0x14) + 1;
            piVar9 = std::min<int>(&local_7e8,&local_7ec);
            local_7e4 = *piVar9;
            local_7f0 = local_7e4 - local_7dc;
            if (local_7f0 < 1) {
              local_26d = 1;
            }
            else {
              local_7d8 = local_7d8 + 2;
              lVar10 = (long)local_7dc - (long)*(int *)(local_48 + 0xc);
              local_7f8 = lVar10;
              iVar3 = std::numeric_limits<int>::max();
              lVar1 = local_7f8;
              if (iVar3 < lVar10) {
                local_7dc = -1;
              }
              else {
                iVar3 = std::numeric_limits<int>::max();
                if (lVar1 < -iVar3) {
                  local_7dc = -1;
                }
                else {
                  local_7dc = local_7dc - *(int *)(local_48 + 0xc);
                }
              }
              if (local_7dc < 0) {
                local_26d = 1;
              }
              else {
                local_b30 = local_78;
                local_b38[0] = local_74;
                in_stack_fffffffffffff4e0 = local_7bc;
                bVar2 = DecodePixelData(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                                        in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                                        in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8,
                                        in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,
                                        in_stack_fffffffffffff8f0,in_stack_fffffffffffff8f8,
                                        in_stack_fffffffffffff900,in_stack_fffffffffffff908,
                                        in_stack_fffffffffffff910,in_stack_fffffffffffff918,
                                        in_stack_fffffffffffff920,in_stack_fffffffffffff928,
                                        in_stack_fffffffffffff930,in_stack_fffffffffffff938);
                if (!bVar2) {
                  local_26d = 1;
                }
              }
            }
          }
        }
        else {
          local_26d = 1;
        }
      }
    }
  }
  else {
    if (*(int *)(local_48 + 0x3c) < 0) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_3f8);
        poVar4 = std::operator<<(local_3e8,"Invalid tile size x : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_48 + 0x3c));
        std::operator<<(poVar4,"\n");
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_418);
        std::__cxx11::string::~string(local_418);
        std::__cxx11::stringstream::~stringstream(local_3f8);
      }
      local_34 = -9;
      goto LAB_001ed85a;
    }
    if (*(int *)(local_48 + 0x40) < 0) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_5a0);
        poVar4 = std::operator<<(local_590,"Invalid tile size y : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_48 + 0x40));
        std::operator<<(poVar4,"\n");
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_5c0);
        std::__cxx11::string::~string(local_5c0);
        std::__cxx11::stringstream::~stringstream(local_5a0);
      }
      local_34 = -9;
      goto LAB_001ed85a;
    }
    local_5c8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_50);
    pvVar5 = calloc(0x20,local_5c8);
    *local_40 = (long)pvVar5;
    local_5cc = 0;
    for (local_5d8 = 0; local_5d8 < local_5c8; local_5d8 = local_5d8 + 1) {
      ppuVar6 = AllocateImage(in_stack_fffffffffffff4f4,
                              (EXRChannelInfo *)
                              CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                              (int *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                              in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8);
      *(uchar ***)(*local_40 + local_5d8 * 0x20 + 0x18) = ppuVar6;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_5d8);
      if (local_60 < (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(*pvVar7 + 0x14)) {
        if (local_68 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_68,"Insufficient data size.\n");
        }
        local_5cc = -4;
        break;
      }
      pvVar11 = local_60;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_5d8);
      lVar1 = local_58;
      local_5e0 = (long)pvVar11 - (*pvVar7 + 0x14);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_5d8);
      local_5e8 = (undefined8 *)(lVar1 + *pvVar7);
      local_5f8 = *local_5e8;
      local_5f0 = local_5e8[1];
      swap4((int *)&local_5f8);
      swap4((int *)((long)&local_5f8 + 4));
      swap4((int *)&local_5f0);
      swap4((int *)((long)&local_5f0 + 4));
      if ((int)local_5f0 != 0) {
        local_5cc = -10;
        break;
      }
      if (local_5f0._4_4_ != 0) {
        local_5cc = -10;
        break;
      }
      local_5fc = *(int *)(local_5e8 + 2);
      swap4(&local_5fc);
      if ((local_5fc < 4) || (local_5e0 < (ulong)(long)local_5fc)) {
        if (local_68 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_68,"Insufficient data length.\n");
        }
        local_5cc = -4;
        break;
      }
      local_5e8 = (undefined8 *)((long)local_5e8 + 0x14);
      local_b38[0] = *(int *)(local_48 + 0x7c);
      local_b30 = *(int *)(local_48 + 4);
      in_stack_fffffffffffff4d8 = local_74;
      in_stack_fffffffffffff4e0 = local_78;
      in_stack_fffffffffffff4e8 = (int)local_5f8;
      in_stack_fffffffffffff607 =
           DecodeTiledPixelData
                     ((uchar **)CONCAT17(in_stack_fffffffffffff55f,in_stack_fffffffffffff558),
                      in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540,
                      in_stack_fffffffffffff538,(size_t)local_258,(int)in_stack_fffffffffffff5a0,
                      (int)in_stack_fffffffffffff5a8,(int)in_stack_fffffffffffff5b0,
                      (int)in_stack_fffffffffffff5b8,(int)local_48,(int)local_b38,
                      (int)*(undefined8 *)(local_48 + 0x68),*(int *)(local_48 + 0x78),
                      *(size_t *)(local_48 + 0x60),(long)*(int *)(local_48 + 0x5c),
                      (EXRAttribute *)(long)local_25c,*(size_t *)(local_48 + 0x80),
                      (EXRChannelInfo *)
                      CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),pvVar11);
      if (!(bool)in_stack_fffffffffffff607) {
        if (local_68 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_68,"Failed to decode tile data.\n");
        }
        local_5cc = -4;
      }
      *(int *)(*local_40 + local_5d8 * 0x20) = (int)local_5f8;
      *(undefined4 *)(*local_40 + local_5d8 * 0x20 + 4) = local_5f8._4_4_;
      *(int *)(*local_40 + local_5d8 * 0x20 + 8) = (int)local_5f0;
      *(int *)(*local_40 + local_5d8 * 0x20 + 0xc) = local_5f0._4_4_;
    }
    if (local_5cc != 0) {
      local_34 = local_5cc;
      goto LAB_001ed85a;
    }
    *(int *)((long)local_40 + 0x1c) = (int)local_5c8;
  }
  if ((local_26d & 1) == 0) {
    for (local_984 = 0; local_984 < *(int *)(local_48 + 0x78); local_984 = local_984 + 1) {
      *(undefined4 *)(*(long *)(local_48 + 0x70) + (long)local_984 * 4) =
           *(undefined4 *)(*(long *)(local_48 + 0x80) + (long)local_984 * 4);
    }
    *(int *)(local_40 + 3) = local_6c;
    *(int *)(local_40 + 2) = local_74;
    *(int *)((long)local_40 + 0x14) = local_78;
    local_34 = 0;
  }
  else {
    if (local_68 != (string *)0x0) {
      std::__cxx11::stringstream::stringstream(local_980);
      std::__cxx11::string::operator+=(local_68,"Invalid data found when decoding pixels.\n");
      std::__cxx11::stringstream::~stringstream(local_980);
    }
    local_34 = -4;
  }
LAB_001ed85a:
  local_26c = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0));
  return local_34;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<tinyexr::tinyexr_uint64> &offsets,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;

#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param,
                                 exr_header->custom_attributes,
                                 int(exr_header->num_custom_attributes), err)) {
      return TINYEXR_ERROR_INVALID_HEADER;
    }
#endif
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_y < exr_header->data_window.min_y) {
    if (err) {
      (*err) += "Invalid data window.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    const int threshold = 1024 * 8192;  // heuristics
    if ((data_width > threshold) || (data_height > threshold)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  bool invalid_data = false;  // TODO(LTE): Use atomic lock for MT safety.

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        calloc(sizeof(EXRTile), static_cast<size_t>(num_tiles)));

    int err_code = TINYEXR_SUCCESS;

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)

    std::vector<std::thread> workers;
    std::atomic<size_t> tile_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_tiles)) {
      num_threads = int(num_tiles);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        size_t tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
          // Allocate memory for each tile.
          exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
              num_channels, exr_header->channels,
              exr_header->requested_pixel_types, exr_header->tile_size_x,
              exr_header->tile_size_y);

          // 16 byte: tile coordinates
          // 4 byte : data size
          // ~      : data(uncompressed or compressed)
          if (offsets[tile_idx] + sizeof(int) * 5 > size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data size.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          size_t data_size =
              size_t(size - (offsets[tile_idx] + sizeof(int) * 5));
          const unsigned char *data_ptr =
              reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

          int tile_coordinates[4];
          memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
          tinyexr::swap4(&tile_coordinates[0]);
          tinyexr::swap4(&tile_coordinates[1]);
          tinyexr::swap4(&tile_coordinates[2]);
          tinyexr::swap4(&tile_coordinates[3]);

          // @todo{ LoD }
          if (tile_coordinates[2] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }
          if (tile_coordinates[3] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }

          int data_len;
          memcpy(&data_len, data_ptr + 16,
                 sizeof(int));  // 16 = sizeof(tile_coordinates)
          tinyexr::swap4(&data_len);

          if (data_len < 4 || size_t(data_len) > data_size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data length.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          // Move to data addr: 20 = 16 + 4;
          data_ptr += 20;

          bool ret = tinyexr::DecodeTiledPixelData(
              exr_image->tiles[tile_idx].images,
              &(exr_image->tiles[tile_idx].width),
              &(exr_image->tiles[tile_idx].height),
              exr_header->requested_pixel_types, data_ptr,
              static_cast<size_t>(data_len), exr_header->compression_type,
              exr_header->line_order, data_width, data_height,
              tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
              exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
              static_cast<size_t>(exr_header->num_custom_attributes),
              exr_header->custom_attributes,
              static_cast<size_t>(exr_header->num_channels),
              exr_header->channels, channel_offset_list);

          if (!ret) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Failed to decode tile data.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
          }

          exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
          exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
          exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
          exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }  // num_thread loop

    for (auto &t : workers) {
      t.join();
    }

#else
    }
#endif

    if (err_code != TINYEXR_SUCCESS) {
      return err_code;
    }

    exr_image->num_tiles = static_cast<int>(num_tiles);
  } else {  // scanline format

    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(&line_no);
            tinyexr::swap4(&data_len);

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window.max_y + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window.min_y);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window.min_y;
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      std::stringstream ss;
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}